

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_lfdepx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 EA_00;
  TCGv_i64 val;
  TCGv_i64 t0;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
      gen_set_access_type(ctx,0x30);
      EA_00 = tcg_temp_new_i64(tcg_ctx_00);
      val = tcg_temp_new_i64(tcg_ctx_00);
      gen_addr_reg_index(ctx,EA_00);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val,EA_00,8,ctx->default_tcg_memop_mask | MO_64);
      regno = rD(ctx->opcode);
      set_fpr(tcg_ctx_00,regno,val);
      tcg_temp_free_i64(tcg_ctx_00,EA_00);
      tcg_temp_free_i64(tcg_ctx_00,val);
    }
    else {
      gen_exception(ctx,7);
    }
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_lfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_LOAD, DEF_MEMOP(MO_Q));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}